

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O1

Element __thiscall wasm::RandomLattice::makeElement(RandomLattice *this)

{
  RandomLattice *pRVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  LatticeImpl *pLVar4;
  _Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  _Var5;
  long lVar6;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *extraout_RDX_11;
  _Head_base<0UL,_void_*,_false> _Var7;
  int iVar8;
  ulong uVar9;
  undefined8 *in_RSI;
  _Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false> unaff_R13;
  _Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false> _Var10;
  RandomLattice *this_00;
  long lVar11;
  bool bVar12;
  Element EVar13;
  RandomLattice local_d8;
  RandomLattice local_c8;
  RandomLattice local_b8;
  _Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  a_Stack_a8 [2];
  undefined1 auStack_98 [8];
  vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
  elem;
  _Variadic_union<wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
  local_68;
  undefined1 local_48;
  _Tuple_impl<1UL,_void_(*)(void_*)> local_38;
  undefined4 extraout_var;
  
  lVar6 = in_RSI[1];
  lVar11 = 0;
  if ((lVar6 != 0) && (*(char *)(lVar6 + 0x28) == '\0')) {
    lVar11 = lVar6;
  }
  local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)(_Head_base<1UL,_void_(*)(void_*),_false>)this;
  if (lVar11 != 0) {
    RandomFullLattice::makeElement((RandomFullLattice *)auStack_98);
    local_68._M_rest._0_8_ =
         (undefined8)(_Uninitialized<wasm::analysis::Flat<unsigned_int>::Element,_true>)auStack_98;
    local_68._8_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48 = 0;
    pLVar4 = (LatticeImpl *)operator_new(0x28);
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)pLVar4,
                      (_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)&local_68._M_first);
    *(Random **)local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
         (Random *)
         RandomElement<wasm::RandomLattice>::RandomElement::anon_class_1_0_00000001::__invoke;
    (((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
       *)((long)local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl + 8))->_M_t).
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl = pLVar4;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_68._M_first);
    _Var7._M_head_impl = extraout_RDX;
    if (elem.
        super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)auStack_98)();
      _Var7._M_head_impl = extraout_RDX_00;
    }
    if (lVar11 != 0) goto LAB_00198680;
  }
  if (in_RSI[1] == 0) {
    bVar12 = false;
  }
  else {
    bVar12 = *(char *)(in_RSI[1] + 0x28) == '\x01';
  }
  if (bVar12) {
    uVar3 = Random::upTo((Random *)*in_RSI,6);
    if (uVar3 == 5) {
      local_68._M_rest._0_8_ = (undefined8)(Element)0x200000000;
      local_48 = 1;
      pLVar4 = (LatticeImpl *)operator_new(0x28);
    }
    else if (uVar3 == 4) {
      local_68._M_rest._0_8_ = (undefined8)(Element)0x0;
      local_48 = 1;
      pLVar4 = (LatticeImpl *)operator_new(0x28);
    }
    else {
      local_68._M_rest._0_8_ = (undefined8)((ulong)uVar3 | 0x100000000);
      local_48 = 1;
      pLVar4 = (LatticeImpl *)operator_new(0x28);
    }
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)pLVar4,
                      (_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)&local_68._M_first);
    *(Random **)local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
         (Random *)
         RandomElement<wasm::RandomLattice>::RandomElement::anon_class_1_0_00000001::__invoke;
    (((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
       *)((long)local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl + 8))->_M_t).
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl = pLVar4;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_68._M_first);
    _Var7._M_head_impl = extraout_RDX_01;
    if (bVar12) goto LAB_00198680;
  }
  lVar6 = in_RSI[1];
  lVar11 = 0;
  if ((lVar6 != 0) && (*(char *)(lVar6 + 0x28) == '\x02')) {
    lVar11 = lVar6;
  }
  if (lVar11 != 0) {
    _Var5._M_u = (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
                  )Random::upTo((Random *)*in_RSI,4);
    _Var5._4_4_ = extraout_var;
    a_Stack_a8[1] = _Var5;
    if (_Var5._M_u !=
        (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
         )0x0) {
      makeElement(&local_d8);
      unaff_R13._M_head_impl =
           (LatticeImpl *)
           local_d8.lattice._M_t.
           super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
           .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl;
      local_d8.lattice._M_t.
      super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      ._M_t.
      super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
      .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
            )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
              )0x0;
      a_Stack_a8[1] =
           (_Variant_storage_alias<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
            )local_d8.rand;
    }
    uVar2 = local_68._16_8_;
    local_68._16_8_ = local_68._16_8_ & 0xffffffffffffff00;
    _Var10._M_head_impl = unaff_R13._M_head_impl;
    if (_Var5._M_u !=
        (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
         )0x0) {
      local_68._17_7_ = SUB87(uVar2,1);
      local_68._16_1_ = 1;
      _Var10._M_head_impl = (LatticeImpl *)0x0;
      local_68._M_rest._0_8_ = (undefined8)a_Stack_a8[1];
      local_68._8_8_ = unaff_R13._M_head_impl;
    }
    local_48 = 2;
    pLVar4 = (LatticeImpl *)operator_new(0x28);
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)pLVar4,
                      (_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)&local_68._M_first);
    *(Random **)local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
         (Random *)
         RandomElement<wasm::RandomLattice>::RandomElement::anon_class_1_0_00000001::__invoke;
    (((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
       *)((long)local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl + 8))->_M_t).
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl = pLVar4;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_68._M_first);
    _Var7._M_head_impl = extraout_RDX_02;
    if ((_Var5._M_u !=
         (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
          )0x0) &&
       ((_Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         )_Var10._M_head_impl != (LatticeImpl *)0x0)) {
      (*(code *)a_Stack_a8[1])(_Var10._M_head_impl);
      _Var7._M_head_impl = extraout_RDX_03;
    }
    if ((_Var5._M_u !=
         (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
          )0x0) &&
       (local_d8.lattice._M_t.
        super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
        .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         )0x0)) {
      (*(code *)local_d8.rand)();
      _Var7._M_head_impl = extraout_RDX_04;
    }
    if (lVar11 != 0) goto LAB_00198680;
  }
  lVar6 = in_RSI[1];
  lVar11 = 0;
  if ((lVar6 != 0) && (*(char *)(lVar6 + 0x28) == '\x03')) {
    lVar11 = lVar6;
  }
  if (lVar11 != 0) {
    makeElement((RandomLattice *)auStack_98);
    makeElement((RandomLattice *)
                &elem.
                 super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    lVar6 = 0;
    do {
      uVar2 = *(undefined8 *)
               ((long)&elem.
                       super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar6);
      *(undefined8 *)((long)&local_68 + lVar6) = *(undefined8 *)(auStack_98 + lVar6);
      *(undefined8 *)((long)&local_68 + lVar6 + 8) = uVar2;
      *(undefined8 *)
       ((long)&elem.
               super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar6) = 0;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x20);
    local_48 = 3;
    pLVar4 = (LatticeImpl *)operator_new(0x28);
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)pLVar4,
                      (_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)&local_68._M_first);
    *(Random **)local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
         (Random *)
         RandomElement<wasm::RandomLattice>::RandomElement::anon_class_1_0_00000001::__invoke;
    (((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
       *)((long)local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl + 8))->_M_t).
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl = pLVar4;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_68._M_first);
    lVar6 = 0x20;
    _Var7._M_head_impl = extraout_RDX_05;
    do {
      if (*(long *)((long)&a_Stack_a8[1]._M_u + lVar6) != 0) {
        (**(code **)((long)&a_Stack_a8[0]._M_u + lVar6))();
        _Var7._M_head_impl = extraout_RDX_06;
      }
      *(undefined8 *)((long)&a_Stack_a8[1]._M_u + lVar6) = 0;
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != 0);
    if (lVar11 != 0) goto LAB_00198680;
  }
  lVar6 = in_RSI[1];
  lVar11 = 0;
  if ((lVar6 != 0) && (*(char *)(lVar6 + 0x28) == '\x04')) {
    lVar11 = lVar6;
  }
  if (lVar11 != 0) {
    auStack_98._0_4_ =
         (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
          )0x0;
    auStack_98[4] = '\0';
    auStack_98._5_3_ = 0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ::reserve((vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
               *)auStack_98,*(size_type *)(lVar11 + 0x10));
    if (*(long *)(lVar11 + 0x10) != 0) {
      uVar9 = 0;
      do {
        makeElement((RandomLattice *)&local_68._M_first);
        std::
        vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>
        ::emplace_back<wasm::RandomElement<wasm::RandomLattice>>
                  ((vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>
                    *)auStack_98,(RandomElement<wasm::RandomLattice> *)&local_68._M_first);
        if ((pointer)local_68._8_8_ != (pointer)0x0) {
          (*(code *)local_68._M_rest._0_8_)();
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < *(ulong *)(lVar11 + 0x10));
    }
    local_68._M_rest._0_8_ =
         (undefined8)(_Uninitialized<wasm::analysis::Flat<unsigned_int>::Element,_true>)auStack_98;
    local_68._8_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68._16_8_ =
         elem.
         super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_98._0_4_ =
         (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
          )0x0;
    auStack_98[4] = '\0';
    auStack_98._5_3_ = 0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48 = 4;
    pLVar4 = (LatticeImpl *)operator_new(0x28);
    std::__detail::__variant::
    _Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::_Move_ctor_base((_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)pLVar4,
                      (_Move_ctor_base<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                       *)&local_68._M_first);
    *(Random **)local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
         (Random *)
         RandomElement<wasm::RandomLattice>::RandomElement::anon_class_1_0_00000001::__invoke;
    (((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
       *)((long)local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl + 8))->_M_t).
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl = pLVar4;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_68._M_first);
    std::
    vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ::~vector((vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
               *)auStack_98);
    _Var7._M_head_impl = extraout_RDX_07;
    if (lVar11 != 0) goto LAB_00198680;
  }
  lVar6 = in_RSI[1];
  lVar11 = 0;
  if ((lVar6 != 0) && (*(char *)(lVar6 + 0x28) == '\x05')) {
    lVar11 = lVar6;
  }
  if (lVar11 != 0) {
    makeElement(&local_c8);
    makeElement(&local_b8);
    local_68._8_8_ =
         local_b8.lattice._M_t.
         super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl;
    local_68._24_8_ =
         local_c8.lattice._M_t.
         super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl;
    local_b8.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    local_68._M_rest._0_8_ =
         (undefined8)
         (_Uninitialized<wasm::analysis::Flat<unsigned_int>::Element,_true>)local_b8.rand;
    local_c8.lattice._M_t.
    super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
    .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>,_true,_true>
          )(__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
            )0x0;
    auStack_98 = (undefined1  [8])local_b8.rand;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8.rand;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._16_8_ = local_c8.rand;
    elem.
    super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48 = 5;
    RandomElement<wasm::RandomLattice>::RandomElement
              ((RandomElement<wasm::RandomLattice> *)
               local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl,
               (ElementImpl *)&local_68._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_68._M_first);
    std::
    _Tuple_impl<0UL,_wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>
                    *)auStack_98);
    _Var7._M_head_impl = extraout_RDX_08;
    if (local_b8.lattice._M_t.
        super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
        .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         )0x0) {
      (*(code *)local_b8.rand)();
      _Var7._M_head_impl = extraout_RDX_09;
    }
    if (local_c8.lattice._M_t.
        super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
        .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
         )0x0) {
      (*(code *)local_c8.rand)();
      _Var7._M_head_impl = extraout_RDX_10;
    }
    if (lVar11 != 0) goto LAB_00198680;
  }
  pRVar1 = (RandomLattice *)in_RSI[1];
  this_00 = (RandomLattice *)0x0;
  if ((pRVar1 != (RandomLattice *)0x0) &&
     (*(char *)&pRVar1[2].lattice._M_t.
                super___uniq_ptr_impl<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::RandomLattice::LatticeImpl_*,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                .super__Head_base<0UL,_wasm::RandomLattice::LatticeImpl_*,_false>._M_head_impl ==
      '\x06')) {
    this_00 = pRVar1;
  }
  if (this_00 != (RandomLattice *)0x0) {
    makeElement((RandomLattice *)&local_68._M_first);
    bVar12 = join(this_00,(Element *)(this_00 + 1),(Element *)&local_68._M_first);
    iVar8 = 0;
    if (bVar12) {
      iVar8 = *(int *)&this_00[2].rand + 1;
      *(int *)&this_00[2].rand = iVar8;
    }
    if ((pointer)local_68._8_8_ != (pointer)0x0) {
      (*(code *)local_68._M_rest._0_8_)();
    }
    local_68._8_4_ = iVar8;
    local_48 = 6;
    local_68._M_rest._0_8_ = (undefined8)(this_00 + 1);
    RandomElement<wasm::RandomLattice>::RandomElement
              ((RandomElement<wasm::RandomLattice> *)
               local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl,
               (ElementImpl *)&local_68._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::~_Variant_storage((_Variant_storage<false,_wasm::RandomElement<wasm::RandomFullLattice>,_wasm::analysis::Flat<unsigned_int>::Element,_wasm::analysis::Lift<wasm::RandomLattice>::Element,_std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>,_std::vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>,_std::tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>,_wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                         *)&local_68._M_first);
    _Var7._M_head_impl = extraout_RDX_11;
    if (this_00 != (RandomLattice *)0x0) {
LAB_00198680:
      EVar13.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
      super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
      _M_head_impl = _Var7._M_head_impl;
      EVar13.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
      super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
      super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
           local_38.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl;
      return (Element)EVar13.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                      super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>;
    }
  }
  wasm::handle_unreachable
            ("unexpected lattice",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
             ,0x17f);
}

Assistant:

RandomLattice::Element RandomLattice::makeElement() const noexcept {
  if (const auto* l = std::get_if<RandomFullLattice>(lattice.get())) {
    return ElementImpl{l->makeElement()};
  }
  if (const auto* l = std::get_if<Flat<uint32_t>>(lattice.get())) {
    auto pick = rand.upTo(6);
    switch (pick) {
      case 4:
        return ElementImpl{l->getBottom()};
      case 5:
        return ElementImpl{l->getTop()};
      default:
        return ElementImpl{l->get(std::move(pick))};
    }
  }
  if (const auto* l = std::get_if<Lift<RandomLattice>>(lattice.get())) {
    return ElementImpl{rand.oneIn(4) ? l->getBottom()
                                     : l->get(l->lattice.makeElement())};
  }
  if (const auto* l = std::get_if<ArrayLattice>(lattice.get())) {
    return ElementImpl{typename ArrayLattice::Element{
      l->lattice.makeElement(), l->lattice.makeElement()}};
  }
  if (const auto* l = std::get_if<Vector<RandomLattice>>(lattice.get())) {
    std::vector<typename RandomLattice::Element> elem;
    elem.reserve(l->size);
    for (size_t i = 0; i < l->size; ++i) {
      elem.push_back(l->lattice.makeElement());
    }
    return ElementImpl{std::move(elem)};
  }
  if (const auto* l = std::get_if<TupleLattice>(lattice.get())) {
    return ElementImpl{
      typename TupleLattice::Element{std::get<0>(l->lattices).makeElement(),
                                     std::get<1>(l->lattices).makeElement()}};
  }
  if (const auto* l = std::get_if<SharedPath<RandomLattice>>(lattice.get())) {
    auto elem = l->getBottom();
    l->join(elem, l->lattice.makeElement());
    return ElementImpl{elem};
  }
  WASM_UNREACHABLE("unexpected lattice");
}